

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

astcenc_error validate_block_size(uint block_x,uint block_y,uint block_z)

{
  bool bVar1;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  bool have_capacity;
  bool is_legal;
  undefined1 local_14;
  undefined1 local_13;
  undefined4 local_4;
  
  if (in_EDX < 2) {
    bVar1 = is_legal_2d_block_size(in_EDI,in_ESI);
    local_13 = true;
    if (bVar1) goto LAB_00542e7b;
  }
  local_14 = false;
  if (1 < in_EDX) {
    local_14 = is_legal_3d_block_size(in_EDI,in_ESI,in_EDX);
  }
  local_13 = local_14;
LAB_00542e7b:
  if (local_13 == false) {
    local_4 = ASTCENC_ERR_BAD_BLOCK_SIZE;
  }
  else if (in_EDI * in_ESI * in_EDX < 0xd9) {
    local_4 = ASTCENC_SUCCESS;
  }
  else {
    local_4 = ASTCENC_ERR_NOT_IMPLEMENTED;
  }
  return local_4;
}

Assistant:

static astcenc_error validate_block_size(
	unsigned int block_x,
	unsigned int block_y,
	unsigned int block_z
) {
	// Test if this is a legal block size at all
	bool is_legal = (((block_z <= 1) && is_legal_2d_block_size(block_x, block_y)) ||
	                 ((block_z >= 2) && is_legal_3d_block_size(block_x, block_y, block_z)));
	if (!is_legal)
	{
		return ASTCENC_ERR_BAD_BLOCK_SIZE;
	}

	// Test if this build has sufficient capacity for this block size
	bool have_capacity = (block_x * block_y * block_z) <= BLOCK_MAX_TEXELS;
	if (!have_capacity)
	{
		return ASTCENC_ERR_NOT_IMPLEMENTED;
	}

	return ASTCENC_SUCCESS;
}